

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chpst.c
# Opt level: O0

void euidgid(char *user,uint ext)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  char local_138 [8];
  char bufnum [40];
  uidgid ugid;
  uint ext_local;
  char *user_local;
  
  if (ext == 0) {
    uVar1 = uidgid_get((uidgid *)(bufnum + 0x20),user);
    if (uVar1 == 0) {
      piVar3 = __errno_location();
      if (*piVar3 != 0) {
        fatal("unable to get password file entry");
      }
      fatalx("unknown account",user);
    }
  }
  else {
    uVar1 = uidgids_get((uidgid *)(bufnum + 0x20),user);
    if (uVar1 == 0) {
      if (*user == ':') {
        fatalx("invalid uid/gids",user + 1);
      }
      piVar3 = __errno_location();
      if (*piVar3 != 0) {
        fatal("unable to get password/group file entry");
      }
      fatalx("unknown user/group",user);
    }
  }
  uVar1 = fmt_ulong(local_138,(ulong)(uint)bufnum._36_4_);
  local_138[uVar1] = '\0';
  iVar2 = pathexec_env("GID",local_138);
  if (iVar2 == 0) {
    die_nomem();
  }
  uVar1 = fmt_ulong(local_138,(ulong)(uint)bufnum._32_4_);
  local_138[uVar1] = '\0';
  iVar2 = pathexec_env("UID",local_138);
  if (iVar2 == 0) {
    die_nomem();
  }
  return;
}

Assistant:

void euidgid(char *user, unsigned int ext) {
  struct uidgid ugid;
  char bufnum[FMT_ULONG];

  if (ext) {
    if (! uidgids_get(&ugid, user)) {
      if (*user == ':') fatalx("invalid uid/gids", user +1);
      if (errno) fatal("unable to get password/group file entry");
      fatalx("unknown user/group", user);
    }
  }
  else
    if (! uidgid_get(&ugid, user)) {
      if (errno) fatal("unable to get password file entry");
      fatalx("unknown account", user);
    }
  bufnum[fmt_ulong(bufnum, *ugid.gid)] =0;
  if (! pathexec_env("GID", bufnum)) die_nomem();
  bufnum[fmt_ulong(bufnum, ugid.uid)] =0;
  if (! pathexec_env("UID", bufnum)) die_nomem();
}